

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directionalscannero1.cpp
# Opt level: O2

int __thiscall
DirectionalScannerO1::nextOnRight
          (DirectionalScannerO1 *this,vector<Pt2i,_std::allocator<Pt2i>_> *scan)

{
  int *piVar1;
  bool bVar2;
  pointer pPVar3;
  bool *pbVar4;
  int iVar5;
  int iVar6;
  bool *pbVar7;
  int x;
  int iVar8;
  int iVar9;
  bool *pbVar10;
  int iVar11;
  Pt2i PStack_38;
  
  if (((this->super_DirectionalScanner).clearance == true) &&
     (pPVar3 = (scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
               super__Vector_impl_data._M_start,
     (scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
     _M_finish != pPVar3)) {
    (scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pPVar3;
  }
  bVar2 = this->rstop;
  iVar11 = (this->super_DirectionalScanner).rcx;
  x = iVar11 + 1;
  (this->super_DirectionalScanner).rcx = x;
  if (bVar2 == true) {
    this->rstop = false;
    pbVar4 = (this->super_DirectionalScanner).fs;
  }
  else {
    pbVar10 = this->rst1;
    if (*pbVar10 == false) {
      pbVar4 = (this->super_DirectionalScanner).fs;
    }
    else {
      pbVar7 = (this->super_DirectionalScanner).rst2;
      if (*pbVar7 == true) {
        (this->super_DirectionalScanner).rcx = iVar11;
        this->rstop = true;
        x = iVar11;
      }
      piVar1 = &(this->super_DirectionalScanner).rcy;
      *piVar1 = *piVar1 + 1;
      pbVar7 = pbVar7 + 1;
      (this->super_DirectionalScanner).rst2 = pbVar7;
      pbVar4 = (this->super_DirectionalScanner).fs;
      if (pbVar4 <= pbVar7) {
        (this->super_DirectionalScanner).rst2 = (this->super_DirectionalScanner).steps;
      }
    }
    pbVar10 = pbVar10 + 1;
    this->rst1 = pbVar10;
    if (pbVar4 <= pbVar10) {
      this->rst1 = (this->super_DirectionalScanner).steps;
    }
  }
  iVar11 = (this->super_DirectionalScanner).rcy;
  pbVar10 = (this->super_DirectionalScanner).rst2;
  iVar5 = (this->super_DirectionalScanner).dla;
  iVar6 = (this->super_DirectionalScanner).dlb;
  iVar8 = (this->super_DirectionalScanner).dlc2;
  for (iVar9 = iVar11 * iVar6;
      (((this->super_DirectionalScanner).xmax <= x ||
       (iVar11 < (this->super_DirectionalScanner).ymin)) && (iVar8 <= iVar5 * x + iVar9));
      iVar9 = iVar9 + iVar6) {
    x = x - (uint)*pbVar10;
    iVar11 = iVar11 + 1;
    pbVar10 = pbVar10 + 1;
    if (pbVar4 <= pbVar10) {
      pbVar10 = (this->super_DirectionalScanner).steps;
    }
  }
  for (; ((iVar8 <= iVar6 * iVar11 + iVar5 * x && ((this->super_DirectionalScanner).xmin <= x)) &&
         (iVar11 < (this->super_DirectionalScanner).ymax)); iVar11 = iVar11 + 1) {
    Pt2i::Pt2i(&PStack_38,x,iVar11);
    std::vector<Pt2i,_std::allocator<Pt2i>_>::emplace_back<Pt2i>(scan,&PStack_38);
    pbVar4 = pbVar10 + 1;
    if ((this->super_DirectionalScanner).fs <= pbVar4) {
      pbVar4 = (this->super_DirectionalScanner).steps;
    }
    x = x - (uint)*pbVar10;
    iVar5 = (this->super_DirectionalScanner).dla;
    iVar6 = (this->super_DirectionalScanner).dlb;
    iVar8 = (this->super_DirectionalScanner).dlc2;
    pbVar10 = pbVar4;
  }
  return (int)((ulong)((long)(scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int DirectionalScannerO1::nextOnRight (std::vector<Pt2i> &scan)
{
  // Prepares the next scan
  if (clearance) scan.clear ();
  if (rstop)
  {
    rcx ++;
    rstop = false;
  }
  else
  {
    rcx ++;
    if (*rst1)
    {
      if (*rst2)
      {
        rcx --;
        rstop = true;
      }
      rcy ++;
      if (++rst2 >= fs) rst2 = steps;
    }
    if (++rst1 >= fs) rst1 = steps;
  }

  // Computes the next scan
  int x = rcx;
  int y = rcy;
  bool *nst = rst2;
  while ((x >= xmax || y < ymin) && dla * x + dlb * y >= dlc2)
  {
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  while (dla * x + dlb * y >= dlc2 && x >= xmin && y < ymax)
  {
    scan.push_back (Pt2i (x, y));
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  return ((int) (scan.size ()));
}